

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

int read_features_json<true>(vw *all,v_array<example_*> *examples)

{
  uint64_t *puVar1;
  parser *ppVar2;
  bool bVar3;
  size_t sVar4;
  example *ae;
  substring example;
  size_t num_chars;
  char *line;
  undefined1 local_38;
  undefined7 uStack_37;
  example *local_30;
  
  do {
    sVar4 = read_features(all,(char **)&local_30,(size_t *)&local_38);
    if (sVar4 == 0) {
      return 0;
    }
    *(undefined1 *)
     ((long)(local_30->super_example_predict).feature_space + CONCAT71(uStack_37,local_38) + -0x20)
         = 0;
    bVar3 = parse_line_json<true>(all,(char *)local_30,CONCAT71(uStack_37,local_38),examples);
  } while (!bVar3);
  if (8 < (ulong)((long)examples->_end - (long)examples->_begin)) {
    ppVar2 = all->p;
    ae = VW::object_pool<example,_example_initializer>::get_object(&ppVar2->example_pool);
    ae->in_use = true;
    puVar1 = &ppVar2->begin_parsed_examples;
    *puVar1 = *puVar1 + 1;
    local_38 = '\0';
    example.end = &local_38;
    example.begin = &local_38;
    substring_to_example(all,ae,example);
    local_30 = ae;
    v_array<example_*>::push_back(examples,&local_30);
  }
  return 1;
}

Assistant:

int read_features_json(vw* all, v_array<example*>& examples)
{
  // Keep reading lines until a valid set of examples is produced.
  bool reread;
  do
  {
    reread = false;

    char* line;
    size_t num_chars;
    size_t num_chars_initial = read_features(all, line, num_chars);
    if (num_chars_initial < 1)
      return (int)num_chars_initial;

    // Ensure there is a null terminator.
    line[num_chars] = '\0';

    reread = !parse_line_json<audit>(all, line, num_chars, examples);
  } while (reread);

  prepare_for_learner(all, examples);

  return 1;
}